

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(cmGeneratorTarget *target)

{
  cmMakefile *makefile;
  bool bVar1;
  string mocsComp;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_60,"AUTOMOC",(allocator *)&local_40);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(target,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    makefile = target->Target->Makefile;
    GetAutogenTargetBuildDir_abi_cxx11_(&local_40,target);
    std::operator+(&local_60,&local_40,"/mocs_compilation.cpp");
    std::__cxx11::string::~string((string *)&local_40);
    AddGeneratedSource(makefile,&local_60,MOC);
    cmGeneratorTarget::AddSource(target,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::InitializeAutogenSources(
  cmGeneratorTarget* target)
{
  if (target->GetPropertyAsBool("AUTOMOC")) {
    cmMakefile* makefile = target->Target->GetMakefile();
    // Mocs compilation file
    const std::string mocsComp =
      GetAutogenTargetBuildDir(target) + "/mocs_compilation.cpp";
    AddGeneratedSource(makefile, mocsComp, cmQtAutoGeneratorCommon::MOC);
    target->AddSource(mocsComp);
  }
}